

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

action __thiscall
Search::search::predict
          (search *this,example *ec,ptag mytag,action *oracle_actions,size_t oracle_actions_cnt,
          ptag *condition_on,char *condition_on_names,action *allowed_actions,
          size_t allowed_actions_cnt,float *allowed_actions_cost,size_t learner_id,float weight)

{
  action_repr item;
  action_repr item_00;
  action a_00;
  size_t sVar1;
  action_repr *paVar2;
  action *in_RCX;
  ulong uVar3;
  uint in_EDX;
  long *in_RDI;
  size_t in_R8;
  undefined8 in_R9;
  features *in_stack_00000008;
  value_type *in_stack_00000010;
  features *in_stack_00000018;
  size_t in_stack_00000020;
  v_array<Search::action_repr> *in_stack_00000028;
  action a;
  float a_cost;
  size_t in_stack_000000e8;
  float in_stack_0000037c;
  size_t in_stack_00000380;
  action *in_stack_00000388;
  ptag in_stack_00000394;
  size_t in_stack_00000398;
  example *in_stack_000003a0;
  search_private *in_stack_000003a8;
  ptag *in_stack_000003d0;
  char *in_stack_000003d8;
  action *in_stack_000003e0;
  size_t in_stack_000003e8;
  float *in_stack_000003f0;
  size_t in_stack_000003f8;
  float *in_stack_00000400;
  float loss;
  action _a;
  v_array<Search::action_repr> *v;
  undefined4 *puVar4;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 local_58 [4];
  size_t local_48;
  action *local_40;
  uint local_34;
  
  loss = (float)((ulong)in_R9 >> 0x20);
  local_58[0] = 0;
  puVar4 = local_58;
  local_48 = in_R8;
  local_40 = in_RCX;
  local_34 = in_EDX;
  a_00 = search_predict(in_stack_000003a8,in_stack_000003a0,in_stack_00000398,in_stack_00000394,
                        in_stack_00000388,in_stack_00000380,in_stack_000003d0,in_stack_000003d8,
                        in_stack_000003e0,in_stack_000003e8,in_stack_000003f0,in_stack_000003f8,
                        in_stack_00000400,in_stack_0000037c);
  v = in_stack_00000028;
  if (*(int *)(*in_RDI + 0x6c) == 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_00000018,
               in_stack_00000010);
    v = in_stack_00000028;
  }
  if (local_34 != 0) {
    uVar3 = (ulong)local_34;
    sVar1 = v_array<Search::action_repr>::size((v_array<Search::action_repr> *)(*in_RDI + 0x158));
    if ((uVar3 < sVar1) &&
       (paVar2 = v_array<Search::action_repr>::operator[]
                           ((v_array<Search::action_repr> *)(*in_RDI + 0x158),(ulong)local_34),
       paVar2->repr != (features *)0x0)) {
      v_array<Search::action_repr>::operator[]
                ((v_array<Search::action_repr> *)(*in_RDI + 0x158),(ulong)local_34);
      features::delete_v(in_stack_00000008);
      paVar2 = v_array<Search::action_repr>::operator[]
                         ((v_array<Search::action_repr> *)(*in_RDI + 0x158),(ulong)local_34);
      if (paVar2->repr != (features *)0x0) {
        operator_delete(paVar2->repr);
      }
    }
    _a = (action)(in_stack_00000020 >> 0x20);
    if ((*(byte *)(*in_RDI + 0x4c) & 1) == 0) {
      action_repr::action_repr((action_repr *)v,_a,in_stack_00000018);
      item_00.repr._0_4_ = in_stack_ffffffffffffff50;
      item_00._0_8_ = puVar4;
      item_00.repr._4_4_ = in_stack_ffffffffffffff54;
      push_at<Search::action_repr>(v,item_00,in_stack_00000020);
    }
    else {
      action_repr::action_repr((action_repr *)v,_a,in_stack_00000018);
      item.repr._0_4_ = in_stack_ffffffffffffff50;
      item._0_8_ = puVar4;
      item.repr._4_4_ = in_stack_ffffffffffffff54;
      push_at<Search::action_repr>(v,item,in_stack_00000020);
    }
  }
  if ((*(byte *)(*in_RDI + 0x11) & 1) != 0) {
    if ((*(byte *)(*in_RDI + 0x14) & 1) == 0) {
      action_hamming_loss(a_00,local_40,local_48);
    }
    else {
      action_cost_loss((action)allowed_actions_cnt,allowed_actions,(float *)condition_on_names,
                       in_stack_000000e8);
    }
    search::loss((search *)in_stack_00000008,loss);
  }
  return a_00;
}

Assistant:

action search::predict(example& ec, ptag mytag, const action* oracle_actions, size_t oracle_actions_cnt,
    const ptag* condition_on, const char* condition_on_names, const action* allowed_actions, size_t allowed_actions_cnt,
    const float* allowed_actions_cost, size_t learner_id, float weight)
{
  float a_cost = 0.;
  action a = search_predict(*priv, &ec, 1, mytag, oracle_actions, oracle_actions_cnt, condition_on, condition_on_names,
      allowed_actions, allowed_actions_cnt, allowed_actions_cost, learner_id, a_cost, weight);
  if (priv->state == INIT_TEST)
    priv->test_action_sequence.push_back(a);
  if (mytag != 0)
  {
    if (mytag < priv->ptag_to_action.size())
    {
      cdbg << "delete_v at " << mytag << endl;
      if (priv->ptag_to_action[mytag].repr != nullptr)
      {
        priv->ptag_to_action[mytag].repr->delete_v();
        delete priv->ptag_to_action[mytag].repr;
      }
    }
    if (priv->acset.use_passthrough_repr)
    {
      assert((mytag >= priv->ptag_to_action.size()) || (priv->ptag_to_action[mytag].repr == nullptr));
      push_at(priv->ptag_to_action, action_repr(a, &(priv->last_action_repr)), mytag);
    }
    else
      push_at(priv->ptag_to_action, action_repr(a, (features*)nullptr), mytag);
    cdbg << "push_at " << mytag << endl;
  }
  if (priv->auto_hamming_loss)
    loss(priv->use_action_costs ? action_cost_loss(a, allowed_actions, allowed_actions_cost, allowed_actions_cnt)
                                : action_hamming_loss(a, oracle_actions, oracle_actions_cnt));
  cdbg << "predict returning " << a << endl;
  return a;
}